

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::BinaryQuadraticModel
          (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
           *this,Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                 *mat,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *labels_vec,double *offset,Vartype vartype,bool fix_format)

{
  DenseMatrix local_48;
  
  (this->_quadmat).super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue = false;
  (this->_quadmat).m_outerSize = -1;
  (this->_quadmat).m_innerSize = 0;
  (this->_quadmat).m_outerIndex = (StorageIndex *)0x0;
  (this->_quadmat).m_innerNonZeros = (StorageIndex *)0x0;
  (this->_quadmat).m_data.m_values = (Scalar *)0x0;
  (this->_quadmat).m_data.m_indices = (StorageIndex *)0x0;
  (this->_quadmat).m_data.m_size = 0;
  (this->_quadmat).m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&this->_quadmat,0,0);
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_label_to_idx)._M_h._M_buckets = &(this->_label_to_idx)._M_h._M_single_bucket;
  (this->_label_to_idx)._M_h._M_bucket_count = 1;
  (this->_label_to_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_label_to_idx)._M_h._M_element_count = 0;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_label_to_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_offset = *offset;
  this->m_vartype = vartype;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_48,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)mat);
  _initialize_quadmat(this,&local_48,labels_vec,fix_format);
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

BinaryQuadraticModel(
        const Eigen::Ref<const DenseMatrix> &mat,
        const std::vector<IndexType> &labels_vec,
        const FloatType &offset,
        const Vartype vartype,
        bool fix_format = true ) :
        m_offset( offset ),
        m_vartype( vartype ) {
      _initialize_quadmat( mat, labels_vec, fix_format );
    }